

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cc
# Opt level: O0

void kratos::zero_out_stubs(Generator *top)

{
  undefined1 local_58 [8];
  StubGeneratorVisitor visitor;
  Generator *top_local;
  
  visitor.super_IRVisitor.visited_._M_h._M_single_bucket = (__node_base_ptr)top;
  StubGeneratorVisitor::StubGeneratorVisitor((StubGeneratorVisitor *)local_58);
  IRVisitor::visit_generator_root_p
            ((IRVisitor *)local_58,
             (Generator *)visitor.super_IRVisitor.visited_._M_h._M_single_bucket);
  StubGeneratorVisitor::~StubGeneratorVisitor((StubGeneratorVisitor *)local_58);
  return;
}

Assistant:

void zero_out_stubs(Generator* top) {
    StubGeneratorVisitor visitor;
    visitor.visit_generator_root_p(top);
}